

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleTarget(cmSetPropertyCommand *this,cmTarget *target)

{
  char *pcVar1;
  char *pcVar2;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  char *local_28;
  char *value;
  char *name;
  cmTarget *target_local;
  cmSetPropertyCommand *this_local;
  
  name = (char *)target;
  target_local = (cmTarget *)this;
  value = (char *)std::__cxx11::string::c_str();
  local_28 = (char *)std::__cxx11::string::c_str();
  pcVar2 = name;
  pcVar1 = value;
  if ((this->Remove & 1U) != 0) {
    local_28 = (char *)0x0;
  }
  if ((this->AppendMode & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,pcVar1,&local_81);
    cmTarget::SetProperty((cmTarget *)pcVar2,&local_80,local_28);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    cmTarget::AppendProperty((cmTarget *)pcVar2,&local_48,local_28,(bool)(this->AppendAsString & 1))
    ;
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  pcVar2 = name;
  pcVar1 = value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,pcVar1,&local_a9);
  cmTarget::CheckProperty((cmTarget *)pcVar2,&local_a8,(this->super_cmCommand).Makefile);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleTarget(cmTarget* target)
{
  // Set or append the property.
  const char* name = this->PropertyName.c_str();
  const char *value = this->PropertyValue.c_str();
  if (this->Remove)
    {
    value = 0;
    }
  if(this->AppendMode)
    {
    target->AppendProperty(name, value, this->AppendAsString);
    }
  else
    {
    target->SetProperty(name, value);
    }

  // Check the resulting value.
  target->CheckProperty(name, this->Makefile);

  return true;
}